

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t * Acb_NtkFindDivs(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Bit_t *vBlock,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  char *__assertion;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(4000);
  p_00->pArray = piVar8;
  if ((p->vObjTrav).nSize < 1) {
    uVar6 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar6) {
      piVar8 = (p->vObjTrav).pArray;
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc((long)(int)uVar6 << 2);
      }
      else {
        piVar8 = (int *)realloc(piVar8,(long)(int)uVar6 << 2);
      }
      (p->vObjTrav).pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_0036db82;
      (p->vObjTrav).nCap = uVar6;
    }
    if (0 < (int)uVar6) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar6 * 4);
    }
    (p->vObjTrav).nSize = uVar6;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (0 < vSupp->nSize) {
    lVar14 = 0;
    do {
      iVar7 = vSupp->pArray[lVar14];
      if (((long)iVar7 < 0) || ((p->vCis).nSize <= iVar7)) goto LAB_0036dafd;
      iVar7 = (p->vCis).pArray[iVar7];
      lVar10 = (long)iVar7;
      if ((lVar10 < 0) || ((p->vObjTrav).nSize <= iVar7)) goto LAB_0036dafd;
      (p->vObjTrav).pArray[lVar10] = p->nObjTravs;
      if (iVar7 == 0) {
        __assertion = "i>0";
        goto LAB_0036db2c;
      }
      iVar2 = (p->vObjWeight).nSize;
      if (iVar2 < 1) goto LAB_0036db1c;
      if (iVar2 <= iVar7) goto LAB_0036dafd;
      if (0 < (p->vObjWeight).pArray[lVar10]) {
        Vec_IntPush(p_00,iVar7);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vSupp->nSize);
  }
  if ((p->vObjTrav).nSize < 1) {
    uVar6 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar6) {
      piVar8 = (p->vObjTrav).pArray;
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc((long)(int)uVar6 << 2);
      }
      else {
        piVar8 = (int *)realloc(piVar8,(long)(int)uVar6 << 2);
      }
      (p->vObjTrav).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
LAB_0036db82:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar6;
    }
    if (0 < (int)uVar6) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar6 * 4);
    }
    (p->vObjTrav).nSize = uVar6;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (1 < (p->vObjType).nSize) {
    uVar13 = 1;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar6 = (uint)(byte)(p->vObjType).pArray[uVar13];
      if ((4 < uVar6) || ((0x19U >> (uVar6 & 0x1f) & 1) == 0)) {
        if ((long)vBlock->nSize <= (long)uVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar6 = (uint)uVar13;
        if (((uint)vBlock->pArray[uVar13 >> 5 & 0x7ffffff] >> (uVar6 & 0x1f) & 1) == 0) {
          uVar9 = (ulong)(p->vObjWeight).nSize;
          if ((long)uVar9 < 1) {
LAB_0036db1c:
            __assertion = "Acb_NtkHasObjWeights(p)";
LAB_0036db2c:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
          }
          if (uVar9 <= uVar13) {
LAB_0036dafd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((0 < (p->vObjWeight).pArray[uVar13]) &&
             (iVar7 = Acb_NtkFindDivs_rec(p,uVar6), iVar7 != 0)) {
            Vec_IntPush(p_00,uVar6);
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)(p->vObjType).nSize);
  }
  uVar6 = p_00->nSize;
  if (1 < (long)(int)uVar6) {
    piVar8 = p_00->pArray;
    uVar9 = 1;
    uVar13 = 0;
    do {
      uVar1 = uVar13 + 1;
      uVar12 = uVar13 & 0xffffffff;
      uVar11 = uVar9;
      do {
        iVar7 = piVar8[uVar11];
        if (((long)iVar7 < 0) || (iVar2 = (p->vObjWeight).nSize, iVar2 <= iVar7)) goto LAB_0036dafd;
        iVar3 = piVar8[(int)uVar12];
        if (((long)iVar3 < 0) || (iVar2 <= iVar3)) goto LAB_0036dafd;
        piVar4 = (p->vObjWeight).pArray;
        uVar5 = uVar11 & 0xffffffff;
        if (piVar4[iVar3] <= piVar4[iVar7]) {
          uVar5 = uVar12;
        }
        uVar12 = uVar5;
        uVar11 = uVar11 + 1;
      } while ((long)(int)uVar6 != uVar11);
      iVar7 = piVar8[uVar13];
      piVar8[uVar13] = piVar8[(int)uVar12];
      piVar8[(int)uVar12] = iVar7;
      uVar9 = uVar9 + 1;
      uVar13 = uVar1;
    } while (uVar1 != uVar6 - 1);
  }
  uVar15 = 3000;
  if ((int)uVar6 < 3000) {
    uVar15 = uVar6;
  }
  if (fVerbose == 0) {
    p_00->nSize = uVar15;
  }
  else {
    printf("Reducing divisor set from %d to ");
    p_00->nSize = uVar15;
    printf("%d.\n",(ulong)uVar15);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindDivs( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Bit_t * vBlock, int fVerbose )
{
    int fPrintWeights = 0;
    int nDivLimit = 3000;
    int i, iObj;
    Vec_Int_t * vDivs = Vec_IntAlloc( 1000 );
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        if ( Acb_ObjWeight(p, iObj) > 0 )
            Vec_IntPush( vDivs, iObj );
    }
    // collect nodes whose support is contained in vSupp
    Acb_NtkIncTravId( p );
    Acb_NtkForEachNode( p, iObj )
        if ( !Vec_BitEntry(vBlock, iObj) && Acb_ObjWeight(p, iObj) > 0 && Acb_NtkFindDivs_rec(p, iObj) )
            Vec_IntPush( vDivs, iObj );
    // sort divisors by cost (first cheap ones; later expensive ones)
    Vec_IntSelectSortCost( Vec_IntArray(vDivs), Vec_IntSize(vDivs), &p->vObjWeight );
    //Vec_IntPrint( vDivs );
    nDivLimit = Abc_MinInt( Vec_IntSize(vDivs), nDivLimit );
    if ( fPrintWeights )
    {
//        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
//            printf( "%d:%d (w=%d)   ", i, iObj, Vec_IntEntry(&p->vObjWeight, iObj) );
//        printf( "\n" );

        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 100) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 10) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 1) % 10 );
        printf( "\n" );
    }
    if ( fVerbose )
    printf( "Reducing divisor set from %d to ", Vec_IntSize(vDivs) );
    Vec_IntShrink( vDivs, nDivLimit );
    if ( fVerbose )
    printf( "%d.\n", Vec_IntSize(vDivs) );
    return vDivs;
}